

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict pointer(c2m_ctx_t c2m_ctx,int no_err_p)

{
  parse_ctx *ppVar1;
  int iVar2;
  char *expected_name;
  node_t_conflict op_00;
  undefined1 local_48 [8];
  pos_t pos;
  node_t_conflict r;
  node_t_conflict op;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  ppVar1 = c2m_ctx->parse_ctx;
  iVar2 = match(c2m_ctx,0x2a,(pos_t *)local_48,(node_code_t *)0x0,(node_t_conflict *)0x0);
  if (iVar2 == 0) {
    if (ppVar1->record_level == 0) {
      expected_name = get_token_name(c2m_ctx,0x2a);
      syntax_error(c2m_ctx,expected_name);
    }
    c2m_ctx_local = (c2m_ctx_t)&err_struct;
  }
  else {
    if (((((short)*(undefined4 *)ppVar1->curr_token == 0x11e) ||
         ((short)*(undefined4 *)ppVar1->curr_token == 0x12e)) ||
        ((short)*(undefined4 *)ppVar1->curr_token == 0x13b)) ||
       ((short)*(undefined4 *)ppVar1->curr_token == 0x114)) {
      pos._8_8_ = type_qual_list(c2m_ctx,no_err_p);
      if ((node *)pos._8_8_ == &err_struct) {
        return &err_struct;
      }
    }
    else {
      pos._8_8_ = new_node(c2m_ctx,N_LIST);
    }
    op_00 = new_pos_node1(c2m_ctx,N_POINTER,_local_48,(node_t_conflict)pos._8_8_);
    if ((short)*(undefined4 *)ppVar1->curr_token == 0x2a) {
      pos._8_8_ = pointer(c2m_ctx,no_err_p);
      if ((node *)pos._8_8_ == &err_struct) {
        return (node_t_conflict)pos._8_8_;
      }
    }
    else {
      pos._8_8_ = new_node(c2m_ctx,N_LIST);
    }
    op_append(c2m_ctx,(node_t_conflict)pos._8_8_,op_00);
    c2m_ctx_local = (c2m_ctx_t)pos._8_8_;
  }
  return (node_t_conflict)c2m_ctx_local;
}

Assistant:

D (pointer) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t op, r;
  pos_t pos;

  PTP ('*', pos);
  if (C (T_CONST) || C (T_RESTRICT) || C (T_VOLATILE) || C (T_ATOMIC)) {
    P (type_qual_list);
  } else {
    r = new_node (c2m_ctx, N_LIST);
  }
  op = new_pos_node1 (c2m_ctx, N_POINTER, pos, r);
  if (C ('*')) {
    P (pointer);
  } else {
    r = new_node (c2m_ctx, N_LIST);
  }
  op_append (c2m_ctx, r, op);
  return r;
}